

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O2

void do_astrip(CHAR_DATA *ch,char *argument)

{
  AFFECT_DATA *pAVar1;
  CHAR_DATA *ch_00;
  char *txt;
  AFFECT_DATA *paf;
  char arg [4608];
  
  one_argument(argument,arg);
  ch_00 = ch;
  if (arg[0] != '\0') {
    ch_00 = get_char_world(ch,arg);
  }
  if (ch_00 == (CHAR_DATA *)0x0) {
    txt = "They aren\'t here.\n\r";
  }
  else {
    pAVar1 = ch_00->affected;
    while (paf = pAVar1, paf != (AFFECT_DATA *)0x0) {
      pAVar1 = paf->next;
      if ((paf->bitvector[0] & 0x1000000) == 0) {
        affect_remove(ch_00,paf);
      }
    }
    if (ch_00 != ch) {
      act("All affects stripped from $N.",ch,(void *)0x0,ch_00,3);
      return;
    }
    txt = "All affects stripped from yourself.\n\r";
  }
  send_to_char(txt,ch);
  return;
}

Assistant:

void do_astrip(CHAR_DATA *ch, char *argument)
{
	CHAR_DATA *victim;
	AFFECT_DATA *af, *af_next;
	char arg[MAX_STRING_LENGTH];

	one_argument(argument, arg);

	if (arg[0] == '\0')
		victim = ch;
	else
		victim = get_char_world(ch, arg);

	if (victim == nullptr)
	{
		send_to_char("They aren't here.\n\r", ch);
		return;
	}

	for (af = victim->affected; af != nullptr; af = af_next)
	{
		af_next = af->next;

		if (IS_SET(af->bitvector, AFF_PERMANENT))
			continue;

		affect_remove(victim, af);
	}

	if (victim != ch)
		act("All affects stripped from $N.", ch, 0, victim, TO_CHAR);
	else
		send_to_char("All affects stripped from yourself.\n\r", ch);
}